

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O2

wchar_t pfdistances_to_path(pfdistances *a,loc grid,int16_t **step_dirs)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  int16_t *p;
  loc_conflict lVar5;
  uint uVar6;
  loc_conflict grid1;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong local_48;
  
  if (-1 < (long)grid && a != (pfdistances *)0x0) {
    uVar7 = (ulong)grid >> 0x20;
    wVar4 = grid.x;
    if (((L'\xffffffff' < wVar4 && grid.y < a->height) && (wVar4 < a->width)) &&
       (-1 < a->rows[uVar7][(uint)(wVar4 & 0x7fffffff)])) {
      _Var1 = loc_eq((loc_conflict)grid,(loc_conflict)a->start);
      if (!_Var1) {
        iVar2 = grid.y - (a->start).y;
        iVar9 = -iVar2;
        if (0 < iVar2) {
          iVar9 = iVar2;
        }
        iVar3 = wVar4 - (a->start).x;
        iVar2 = -iVar3;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        uVar6 = iVar9 + iVar2 + 2;
        p = (int16_t *)mem_alloc((ulong)((iVar9 + iVar2) * 2 + 4));
        local_48 = 0;
        while( true ) {
          grid1 = (loc_conflict)((ulong)grid & 0xffffffff | uVar7 << 0x20);
          _Var1 = loc_eq(grid1,(loc_conflict)a->start);
          if (_Var1) {
            if (step_dirs == (int16_t **)0x0) {
              mem_free(p);
            }
            else {
              *step_dirs = p;
            }
            return (wchar_t)local_48;
          }
          iVar9 = a->rows[(int)uVar7][grid.x];
          uVar7 = 0xffffffffffffffff;
          for (uVar8 = 0; uVar8 != 8; uVar8 = uVar8 + 1) {
            lVar5 = loc_sum(grid1,(loc_conflict)ddgrid_ddd[uVar8]);
            if ((((long)lVar5 < 0) || (wVar4 = lVar5.x, wVar4 < L'\0')) ||
               ((a->height <= lVar5.y || (a->width <= wVar4)))) {
              __assert_fail("next.y >= 0 && next.y < a->height && next.x >= 0 && next.x < a->width",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                            ,0x247,
                            "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                           );
            }
            iVar2 = a->rows[(ulong)lVar5 >> 0x20][(uint)(wVar4 & 0x7fffffff)];
            if (-1 < iVar2 && iVar2 < iVar9) {
              uVar7 = uVar8 & 0xffffffff;
              iVar9 = iVar2;
            }
          }
          if ((int)uVar7 < 0) break;
          if ((long)(int)uVar6 < (long)local_48) {
            __assert_fail("length <= allocated && allocated > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                          ,0x25a,
                          "int pfdistances_to_path(const struct pfdistances *, struct loc, int16_t **)"
                         );
          }
          if (local_48 == uVar6) {
            if (0x3fffffff < (int)uVar6) break;
            p = (int16_t *)mem_realloc(p,(ulong)(uVar6 << 2));
            uVar6 = uVar6 * 2;
          }
          p[local_48] = 10 - ddd[uVar7 & 0xffffffff];
          local_48 = local_48 + 1;
          grid = (loc)loc_sum(grid1,(loc_conflict)ddgrid_ddd[uVar7 & 0xffffffff]);
          uVar7 = (ulong)grid >> 0x20;
        }
        mem_free(p);
        if (step_dirs == (int16_t **)0x0) {
          return L'\xffffffff';
        }
        *step_dirs = (int16_t *)0x0;
        return L'\xffffffff';
      }
      wVar4 = L'\0';
      goto LAB_001ae56f;
    }
  }
  wVar4 = L'\xffffffff';
LAB_001ae56f:
  if (step_dirs != (int16_t **)0x0) {
    *step_dirs = (int16_t *)0x0;
  }
  return wVar4;
}

Assistant:

int pfdistances_to_path(const struct pfdistances *a, struct loc grid,
		int16_t **step_dirs)
{
	int16_t *steps;
	int allocated, length;

	if (!a || grid.y < 0 || grid.y >= a->height || grid.x < 0 ||
			grid.x >= a->width || a->rows[grid.y][grid.x] < 0) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	if (loc_eq(grid, a->start)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/* Work backwards from the destination to the starting point. */
	allocated = 2 + ABS(grid.y - a->start.y) + ABS(grid.x - a->start.x);
	length = 0;
	steps = mem_alloc(allocated * sizeof(*steps));
	while (!loc_eq(grid, a->start)) {
		int k, best_k = -1, best_distance = a->rows[grid.y][grid.x];

		/* Find the next step. */
		for (k = 0; k < 8; ++k) {
			struct loc next = loc_sum(grid, ddgrid_ddd[k]);
			int try_distance;

			/*
			 * The impassable boundary imposed on the distances
			 * array should mean the trial step is always in bounds.
			 */
			assert(next.y >= 0 && next.y < a->height
				&& next.x >= 0 && next.x < a->width);
			try_distance = a->rows[next.y][next.x];
			if (try_distance >= 0 && best_distance > try_distance) {
				best_distance = try_distance;
				best_k = k;
			}
		}

		/*
		 * Bail out if stepping backwards did not improve the distance.
		 */
		if (best_k < 0) {
			mem_free(steps);
			if (step_dirs) {
				*step_dirs = NULL;
			}
			return -1;
		}

		assert(length <= allocated && allocated > 0);
		if (length == allocated) {
			if (allocated > INT_MAX / 2
					|| (size_t)allocated
					> SIZE_MAX / (2 * sizeof(*steps))) {
				mem_free(steps);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			allocated *= 2;
			steps = mem_realloc(steps, allocated * sizeof(*steps));
		}

		/* Record the opposite of the backward direction. */
		steps[length] = 10 - ddd[best_k];
		++length;

		grid = loc_sum(grid, ddgrid_ddd[best_k]);
	}

	if (step_dirs) {
		*step_dirs = steps;
	} else {
		mem_free(steps);
	}
	return length;
}